

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

MPP_RET name_to_coding_type(char *name,MppCodingType *coding)

{
  int iVar1;
  Ext2Coding *info;
  char ext [50];
  uint local_1c;
  MPP_RET ret;
  RK_U32 i;
  MppCodingType *coding_local;
  char *name_local;
  
  stack0xffffffffffffffe0 = MPP_NOK;
  get_extension(name,(char *)&info);
  for (local_1c = 0; local_1c < 9; local_1c = local_1c + 1) {
    iVar1 = strcmp((char *)&info,map_ext_to_coding[local_1c].ext_name);
    if (iVar1 == 0) {
      *coding = map_ext_to_coding[local_1c].coding;
      stack0xffffffffffffffe0 = MPP_OK;
    }
  }
  return stack0xffffffffffffffe0;
}

Assistant:

MPP_RET name_to_coding_type(const char *name, MppCodingType *coding)
{
    RK_U32 i;
    MPP_RET ret = MPP_NOK;
    char ext[50];

    get_extension(name, ext);

    for (i = 0; i < MPP_ARRAY_ELEMS(map_ext_to_coding); i++) {
        Ext2Coding *info = &map_ext_to_coding[i];

        if (!strcmp(ext, info->ext_name)) {
            *coding = info->coding;
            ret = MPP_OK;
        }
    }

    return ret;
}